

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

void fmt::v9::detail::parse_flags<char>(basic_format_specs<char> *specs,char **it,char *end)

{
  char *pcVar1;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  
  while (*in_RSI != in_RDX) {
    switch(*(undefined1 *)*in_RSI) {
    case 0x20:
      if (((byte)(*(ushort *)(in_RDI + 9) >> 4) & 7) != 2) {
        *(ushort *)(in_RDI + 9) = *(ushort *)(in_RDI + 9) & 0xff8f | 0x30;
      }
      break;
    default:
      return;
    case 0x23:
      *(ushort *)(in_RDI + 9) = *(ushort *)(in_RDI + 9) & 0xff7f | 0x80;
      break;
    case 0x2b:
      *(ushort *)(in_RDI + 9) = *(ushort *)(in_RDI + 9) & 0xff8f | 0x20;
      break;
    case 0x2d:
      *(ushort *)(in_RDI + 9) = *(ushort *)(in_RDI + 9) & 0xfff0 | 1;
      break;
    case 0x30:
      pcVar1 = fill_t<char>::operator[]((fill_t<char> *)(in_RDI + 0xb),0);
      *pcVar1 = '0';
    }
    *in_RSI = *in_RSI + 1;
  }
  return;
}

Assistant:

void parse_flags(basic_format_specs<Char>& specs, const Char*& it,
                 const Char* end) {
  for (; it != end; ++it) {
    switch (*it) {
    case '-':
      specs.align = align::left;
      break;
    case '+':
      specs.sign = sign::plus;
      break;
    case '0':
      specs.fill[0] = '0';
      break;
    case ' ':
      if (specs.sign != sign::plus) {
        specs.sign = sign::space;
      }
      break;
    case '#':
      specs.alt = true;
      break;
    default:
      return;
    }
  }
}